

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
::~BlockingQueue(BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                 *this)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  mutex_type *in_stack_ffffffffffffffd8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffff0;
  
  CLI::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  CLI::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x5a0b82);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x5a0b90);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5a0b9a);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5a0ba4);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x11));
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_fffffffffffffff0);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_fffffffffffffff0);
  return;
}

Assistant:

~BlockingQueue()
        {
            // these locks are primarily for memory synchronization multiple
            // access in the destructor would be a bad thing
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pushElements.clear();
            pullElements.clear();
        }